

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O0

void __thiscall QSpanCollection::updateInsertedRows(QSpanCollection *this,int start,int end)

{
  bool bVar1;
  reference ppSVar2;
  int *piVar3;
  int iVar4;
  int in_EDX;
  int in_ESI;
  list<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_> *in_RDI;
  long in_FS_OFFSET;
  int y;
  Span *span;
  SpanList *__range1;
  int delta;
  iterator it_y;
  iterator __end1;
  iterator __begin1;
  iterator *in_stack_ffffffffffffff68;
  list<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_> *in_stack_ffffffffffffff70
  ;
  list<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_> *in_stack_ffffffffffffff78
  ;
  const_iterator in_stack_ffffffffffffff98;
  _Self local_18;
  _Self local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = std::__cxx11::list<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>::
          empty(in_RDI);
  if (!bVar1) {
    iVar4 = (in_EDX - in_ESI) + 1;
    local_10._M_node = (_List_node_base *)&DAT_aaaaaaaaaaaaaaaa;
    local_10._M_node =
         (_List_node_base *)
         std::__cxx11::list<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>::
         begin(in_stack_ffffffffffffff70);
    local_18._M_node = (_List_node_base *)&DAT_aaaaaaaaaaaaaaaa;
    local_18._M_node =
         (_List_node_base *)
         std::__cxx11::list<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>::end
                   (in_stack_ffffffffffffff70);
    while (bVar1 = std::operator!=(&local_10,&local_18), bVar1) {
      ppSVar2 = std::_List_iterator<QSpanCollection::Span_*>::operator*
                          ((_List_iterator<QSpanCollection::Span_*> *)0x8b0bd5);
      in_stack_ffffffffffffff98._M_node = (_Base_ptr)*ppSVar2;
      if (in_ESI <= *(int *)&(in_stack_ffffffffffffff98._M_node)->_M_parent) {
        if (in_ESI <= (int)(in_stack_ffffffffffffff98._M_node)->_M_color) {
          (in_stack_ffffffffffffff98._M_node)->_M_color =
               iVar4 + (in_stack_ffffffffffffff98._M_node)->_M_color;
        }
        *(int *)&(in_stack_ffffffffffffff98._M_node)->_M_parent =
             iVar4 + *(int *)&(in_stack_ffffffffffffff98._M_node)->_M_parent;
      }
      std::_List_iterator<QSpanCollection::Span_*>::operator++(&local_10);
    }
    QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::begin
              ((QMap<int,_QMap<int,_QSpanCollection::Span_*>_> *)in_RDI);
    while( true ) {
      QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::end
                ((QMap<int,_QMap<int,_QSpanCollection::Span_*>_> *)in_RDI);
      bVar1 = ::operator!=((iterator *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      if (!bVar1) break;
      piVar3 = QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::iterator::key((iterator *)0x8b0c79);
      if (-*piVar3 < in_ESI) {
        QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::iterator::operator++
                  ((iterator *)in_stack_ffffffffffffff70);
      }
      else {
        in_stack_ffffffffffffff70 = in_RDI + 1;
        QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::iterator::value((iterator *)0x8b0cc0);
        QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::insert
                  ((QMap<int,_QMap<int,_QSpanCollection::Span_*>_> *)in_RDI,
                   (int *)in_stack_ffffffffffffff78,
                   (QMap<int,_QSpanCollection::Span_*> *)in_stack_ffffffffffffff70);
        in_stack_ffffffffffffff78 = in_RDI + 1;
        QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::const_iterator::const_iterator
                  ((const_iterator *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
        QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::erase
                  ((QMap<int,_QMap<int,_QSpanCollection::Span_*>_> *)in_stack_ffffffffffffff78,
                   (const_iterator)in_stack_ffffffffffffff98._M_node);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSpanCollection::updateInsertedRows(int start, int end)
{
#ifdef DEBUG_SPAN_UPDATE
    qDebug() << start << end << Qt::endl << index;
#endif
    if (spans.empty())
        return;

    int delta = end - start + 1;
#ifdef DEBUG_SPAN_UPDATE
    qDebug("Before");
#endif
    for (Span *span : spans) {
#ifdef DEBUG_SPAN_UPDATE
        qDebug() << span << *span;
#endif
        if (span->m_bottom < start)
            continue;
        if (span->m_top >= start)
            span->m_top += delta;
        span->m_bottom += delta;
    }

#ifdef DEBUG_SPAN_UPDATE
    qDebug("After");
    qDebug() << spans;
#endif

    for (Index::iterator it_y = index.begin(); it_y != index.end(); ) {
        int y = -it_y.key();
        if (y < start) {
            ++it_y;
            continue;
        }

        index.insert(-y - delta, it_y.value());
        it_y = index.erase(it_y);
    }
#ifdef DEBUG_SPAN_UPDATE
    qDebug() << index;
#endif
}